

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

int run_test_fork_timer(void)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  uint child_pid;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *loop;
  ssize_t sVar5;
  uv_loop_t *loop_00;
  uint extraout_EDX;
  uv_loop_t *unaff_RBX;
  uint uVar6;
  uv_poll_t *puVar7;
  undefined1 *__buf;
  char *loop_01;
  undefined1 uStack_261;
  int iStack_260;
  uint uStack_25c;
  undefined1 auStack_258 [8];
  undefined1 auStack_250 [176];
  uv_loop_t *puStack_1a0;
  uv_loop_t *puStack_198;
  int iStack_188;
  uint uStack_184;
  undefined1 auStack_180 [180];
  uint uStack_cc;
  uv_loop_t *puStack_c8;
  undefined1 auStack_a8 [160];
  
  auStack_a8._152_8_ = 0x14c55a;
  run_timer_loop_once();
  auStack_a8._152_8_ = 0x14c55f;
  _Var1 = fork();
  if (_Var1 == 0) {
    auStack_a8._152_8_ = 0x14c576;
    puVar4 = uv_default_loop();
    auStack_a8._152_8_ = 0x14c57e;
    iVar2 = uv_loop_fork(puVar4);
    if (iVar2 == 0) {
      auStack_a8._152_8_ = 0x14c587;
      run_timer_loop_once();
      goto LAB_0014c587;
    }
  }
  else {
    if (_Var1 != -1) {
      auStack_a8._152_8_ = 0x14c56f;
      assert_wait_child(_Var1);
LAB_0014c587:
      auStack_a8._152_8_ = 0x14c58c;
      unaff_RBX = uv_default_loop();
      auStack_a8._152_8_ = 0x14c5a0;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      auStack_a8._152_8_ = 0x14c5aa;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      auStack_a8._152_8_ = 0x14c5af;
      puVar4 = uv_default_loop();
      auStack_a8._152_8_ = 0x14c5b7;
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      auStack_a8._152_8_ = 0x14c5c4;
      run_test_fork_timer_cold_3();
    }
    auStack_a8._152_8_ = 0x14c5c9;
    run_test_fork_timer_cold_2();
  }
  auStack_a8._152_8_ = run_timer_loop_once;
  run_test_fork_timer_cold_1();
  auStack_a8._152_8_ = unaff_RBX;
  loop = uv_default_loop();
  timer_cb_called = 0;
  puVar4 = loop;
  iVar2 = uv_timer_init(loop,(uv_timer_t *)auStack_a8);
  if (iVar2 == 0) {
    puVar4 = (uv_loop_t *)auStack_a8;
    iVar2 = uv_timer_start((uv_timer_t *)puVar4,timer_cb,1,0);
    if (iVar2 != 0) goto LAB_0014c63a;
    puVar4 = loop;
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0014c63f;
    if (timer_cb_called == 1) {
      return 0;
    }
  }
  else {
    run_timer_loop_once_cold_1();
LAB_0014c63a:
    run_timer_loop_once_cold_2();
LAB_0014c63f:
    run_timer_loop_once_cold_3();
  }
  run_timer_loop_once_cold_4();
  loop_00 = (uv_loop_t *)((ulong)puVar4 & 0xffffffff);
  auStack_180._160_8_ = (__pthread_internal_list *)0x14c662;
  puStack_c8 = loop;
  uVar3 = waitpid((uint)puVar4,(int *)&uStack_cc,0);
  auStack_180._160_8_ = (__pthread_internal_list *)0x14c677;
  printf("Waited pid is %d with status %d\n",(ulong)uVar3,(ulong)uStack_cc);
  if (uVar3 == 0xffffffff) {
    auStack_180._160_8_ = (__pthread_internal_list *)0x14c6a4;
    perror("Failed to wait");
  }
  if (uVar3 == (uint)puVar4) {
    if ((uStack_cc & 0x7f) != 0) goto LAB_0014c6ab;
    if ((uStack_cc & 0xff00) == 0) {
      return uStack_cc;
    }
  }
  else {
    auStack_180._160_8_ = (__pthread_internal_list *)0x14c6ab;
    assert_wait_child_cold_1();
LAB_0014c6ab:
    auStack_180._160_8_ = (__pthread_internal_list *)0x14c6b0;
    assert_wait_child_cold_2();
  }
  auStack_180._160_8_ = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  puStack_198 = (uv_loop_t *)0x14c6c2;
  auStack_180._160_8_ = loop_00;
  run_timer_loop_once();
  puVar4 = (uv_loop_t *)0x1;
  uVar6 = 1;
  puStack_198 = (uv_loop_t *)0x14c6d8;
  iVar2 = socketpair(1,1,0,&iStack_188);
  if (iVar2 == 0) {
    puStack_198 = (uv_loop_t *)0x14c6e5;
    puVar4 = uv_default_loop();
    puVar7 = (uv_poll_t *)auStack_180;
    puStack_198 = (uv_loop_t *)0x14c6f6;
    iVar2 = uv_poll_init(puVar4,puVar7,iStack_188);
    uVar6 = (uint)puVar7;
    if (iVar2 != 0) goto LAB_0014c7e8;
    puStack_198 = (uv_loop_t *)0x14c703;
    child_pid = fork();
    if (child_pid != 0) {
      loop_00 = (uv_loop_t *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_0014c7f2;
      puVar4 = (uv_loop_t *)(ulong)uStack_184;
      uVar6 = 0x19271a;
      puStack_198 = (uv_loop_t *)0x14c729;
      sVar5 = send(uStack_184,"hi\n",3,0);
      if (sVar5 == 3) {
        puStack_198 = (uv_loop_t *)0x14c73a;
        assert_wait_child(child_pid);
LAB_0014c7a4:
        puStack_198 = (uv_loop_t *)0x14c7a9;
        loop_00 = uv_default_loop();
        puStack_198 = (uv_loop_t *)0x14c7bd;
        uv_walk(loop_00,close_walk_cb,(void *)0x0);
        uVar6 = 0;
        puStack_198 = (uv_loop_t *)0x14c7c7;
        uv_run(loop_00,UV_RUN_DEFAULT);
        puStack_198 = (uv_loop_t *)0x14c7cc;
        puVar4 = uv_default_loop();
        puStack_198 = (uv_loop_t *)0x14c7d4;
        iVar2 = uv_loop_close(puVar4);
        if (iVar2 == 0) {
          return 0;
        }
        goto LAB_0014c7ed;
      }
      goto LAB_0014c7f7;
    }
    puStack_198 = (uv_loop_t *)0x14c741;
    puVar4 = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x14c749;
    iVar2 = uv_loop_fork(puVar4);
    if (iVar2 != 0) goto LAB_0014c7fc;
    if (socket_cb_called != 0) goto LAB_0014c801;
    puVar4 = (uv_loop_t *)auStack_180;
    uVar6 = 1;
    puStack_198 = (uv_loop_t *)0x14c774;
    iVar2 = uv_poll_start((uv_poll_t *)puVar4,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014c806;
    puStack_198 = (uv_loop_t *)0x14c788;
    puts("Going to run the loop in the child");
    puStack_198 = (uv_loop_t *)0x14c78d;
    puVar4 = uv_default_loop();
    uVar6 = 0;
    puStack_198 = (uv_loop_t *)0x14c797;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0014c80b;
    if (socket_cb_called == 1) goto LAB_0014c7a4;
  }
  else {
    puStack_198 = (uv_loop_t *)0x14c7e8;
    run_test_fork_socketpair_cold_1();
LAB_0014c7e8:
    puStack_198 = (uv_loop_t *)0x14c7ed;
    run_test_fork_socketpair_cold_2();
LAB_0014c7ed:
    puStack_198 = (uv_loop_t *)0x14c7f2;
    run_test_fork_socketpair_cold_10();
LAB_0014c7f2:
    puStack_198 = (uv_loop_t *)0x14c7f7;
    run_test_fork_socketpair_cold_8();
LAB_0014c7f7:
    puStack_198 = (uv_loop_t *)0x14c7fc;
    run_test_fork_socketpair_cold_9();
LAB_0014c7fc:
    puStack_198 = (uv_loop_t *)0x14c801;
    run_test_fork_socketpair_cold_3();
LAB_0014c801:
    puStack_198 = (uv_loop_t *)0x14c806;
    run_test_fork_socketpair_cold_4();
LAB_0014c806:
    puStack_198 = (uv_loop_t *)0x14c80b;
    run_test_fork_socketpair_cold_5();
LAB_0014c80b:
    puStack_198 = (uv_loop_t *)0x14c810;
    run_test_fork_socketpair_cold_6();
  }
  puStack_198 = (uv_loop_t *)socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_1a0 = loop_00;
  puStack_198 = (uv_loop_t *)(ulong)uVar3;
  if (uVar6 == 0) {
    auStack_250._160_8_ = (__pthread_internal_list *)0x14c837;
    uVar6 = extraout_EDX;
    printf("Socket cb got events %d\n");
    loop_00 = puVar4;
    if ((extraout_EDX & 1) == 0) goto LAB_0014c883;
    if (socket_cb_read_fd == 0) {
LAB_0014c86e:
      uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
      return extraout_EAX;
    }
    uVar6 = 0x2f8ec0;
    auStack_250._160_8_ = (__pthread_internal_list *)0x14c85e;
    sVar5 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar5 == (ulong)socket_cb_read_size * 3) goto LAB_0014c86e;
  }
  else {
    auStack_250._160_8_ = (__pthread_internal_list *)0x14c883;
    socket_cb_cold_1();
LAB_0014c883:
    auStack_250._160_8_ = (__pthread_internal_list *)0x14c888;
    socket_cb_cold_3();
  }
  auStack_250._160_8_ = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  loop_01 = auStack_258;
  auStack_250._160_8_ = loop_00;
  iVar2 = pipe((int *)loop_01);
  if (iVar2 == 0) {
    run_timer_loop_once();
    loop_01 = (char *)0x1;
    uVar6 = 1;
    iVar2 = socketpair(1,1,0,&iStack_260);
    if (iVar2 != 0) goto LAB_0014cae9;
    loop_01 = (char *)uv_default_loop();
    puVar7 = (uv_poll_t *)auStack_250;
    iVar2 = uv_poll_init((uv_loop_t *)loop_01,puVar7,iStack_260);
    uVar6 = (uint)puVar7;
    if (iVar2 != 0) goto LAB_0014caee;
    loop_01 = auStack_250;
    uVar6 = 1;
    iVar2 = uv_poll_start((uv_poll_t *)loop_01,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014caf3;
    loop_01 = (char *)uv_default_loop();
    uVar6 = 2;
    iVar2 = uv_run((uv_loop_t *)loop_01,UV_RUN_NOWAIT);
    if (iVar2 != 1) goto LAB_0014caf8;
    _Var1 = fork();
    if (_Var1 != 0) {
      if (_Var1 == -1) goto LAB_0014cb02;
      loop_01 = auStack_250;
      iVar2 = uv_poll_stop((uv_poll_t *)loop_01);
      if (iVar2 != 0) goto LAB_0014cb07;
      uv_close((uv_handle_t *)auStack_250,(uv_close_cb)0x0);
      loop_01 = (char *)uv_default_loop();
      uVar6 = 0;
      iVar2 = uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
      if (iVar2 != 0) goto LAB_0014cb11;
      if (socket_cb_called != 0) goto LAB_0014cb1b;
      loop_01 = (char *)(ulong)(uint)auStack_258._4_4_;
      uVar6 = 0x19323c;
      sVar5 = write(auStack_258._4_4_,"1",1);
      if (sVar5 != 1) goto LAB_0014cb25;
      loop_01 = (char *)(ulong)uStack_25c;
      uVar6 = 0x19271a;
      sVar5 = send(uStack_25c,"hi\n",3,0);
      if (sVar5 != 3) goto LAB_0014cb2f;
      loop_01 = (char *)uv_default_loop();
      uVar6 = 0;
      iVar2 = uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        if (socket_cb_called != 0) goto LAB_0014cb43;
        assert_wait_child(_Var1);
        goto LAB_0014caa5;
      }
      goto LAB_0014cb39;
    }
    uVar3 = getpid();
    printf("Child is %d\n",(ulong)uVar3);
    loop_01 = (char *)(ulong)(uint)auStack_258._0_4_;
    __buf = &uStack_261;
    sVar5 = read(auStack_258._0_4_,__buf,1);
    uVar6 = (uint)__buf;
    if (sVar5 != 1) goto LAB_0014cb0c;
    loop_01 = (char *)uv_default_loop();
    iVar2 = uv_loop_fork((uv_loop_t *)loop_01);
    if (iVar2 != 0) goto LAB_0014cb16;
    if (socket_cb_called != 0) goto LAB_0014cb20;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_260;
    socket_cb_read_size = 1;
    loop_01 = (char *)uv_default_loop();
    uVar6 = 0;
    iVar2 = uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0014cb2a;
    if (socket_cb_called != 1) goto LAB_0014cb34;
    loop_01 = "Buf %s\n";
    uVar6 = 0x2f8ec0;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014caa5:
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uVar6 = 0;
      uv_run(puVar4,UV_RUN_DEFAULT);
      loop_01 = (char *)uv_default_loop();
      iVar2 = uv_loop_close((uv_loop_t *)loop_01);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0014cafd;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014cae9:
    run_test_fork_socketpair_started_cold_2();
LAB_0014caee:
    run_test_fork_socketpair_started_cold_3();
LAB_0014caf3:
    run_test_fork_socketpair_started_cold_4();
LAB_0014caf8:
    run_test_fork_socketpair_started_cold_5();
LAB_0014cafd:
    run_test_fork_socketpair_started_cold_20();
LAB_0014cb02:
    run_test_fork_socketpair_started_cold_12();
LAB_0014cb07:
    run_test_fork_socketpair_started_cold_13();
LAB_0014cb0c:
    run_test_fork_socketpair_started_cold_6();
LAB_0014cb11:
    run_test_fork_socketpair_started_cold_14();
LAB_0014cb16:
    run_test_fork_socketpair_started_cold_7();
LAB_0014cb1b:
    run_test_fork_socketpair_started_cold_15();
LAB_0014cb20:
    run_test_fork_socketpair_started_cold_8();
LAB_0014cb25:
    run_test_fork_socketpair_started_cold_16();
LAB_0014cb2a:
    run_test_fork_socketpair_started_cold_9();
LAB_0014cb2f:
    run_test_fork_socketpair_started_cold_17();
LAB_0014cb34:
    run_test_fork_socketpair_started_cold_10();
LAB_0014cb39:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014cb43:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar6;
  uv_close((uv_handle_t *)loop_01,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fork_timer) {
  /* Timers continue to work after we fork. */

  /*
   * Establish the loop before we fork to make sure that it
   * has state to get reset after the fork.
   */
  pid_t child_pid;

  run_timer_loop_once();
  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    run_timer_loop_once();
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}